

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::process_single_dash<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,string *arg_name,string *program_name,
          basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  option **ppoVar4;
  undefined1 uVar5;
  allocator local_bb;
  char name [2];
  maybe<pstore::command_line::option_*,_void> handler;
  string local_88;
  maybe<pstore::command_line::option_*,_void> local_68;
  undefined1 local_58 [40];
  
  bVar1 = starts_with((string *)this,"-");
  if (!bVar1) {
    assert_failed("starts_with (arg_name, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                  ,0xc5);
  }
  std::__cxx11::string::erase((ulong)this,0);
  handler.valid_ = false;
  handler._1_7_ = 0;
  handler.storage_ = (type)0x0;
  uVar3 = 1;
  while( true ) {
    uVar5 = (undefined1)uVar3;
    if (((uVar3 & 1) == 0) || (*(long *)(this + 8) == 0)) goto LAB_0010f5dc;
    name[0] = **(char **)this;
    name[1] = '\0';
    std::__cxx11::string::string((string *)local_58,name,&local_bb);
    find_handler((maybe<pstore::command_line::option_*,_void> *)&local_88,(string *)local_58);
    maybe<pstore::command_line::option_*,_void>::operator=
              (&handler,(maybe<pstore::command_line::option_*,_void> *)&local_88);
    if ((char)local_88._M_dataplus._M_p == '\x01') {
      local_88._M_dataplus._M_p._0_1_ = '\0';
    }
    std::__cxx11::string::~string((string *)local_58);
    if (handler.valid_ != true) break;
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&handler);
    iVar2 = (*(*ppoVar4)->_vptr_option[9])();
    if ((char)iVar2 != '\0') break;
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&handler);
    iVar2 = (*(*ppoVar4)->_vptr_option[0xe])();
    std::__cxx11::string::erase((ulong)this,0);
    if ((char)iVar2 == '\0') {
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(&handler);
      uVar3 = (*(*ppoVar4)->_vptr_option[0x10])();
    }
    else {
      if (*(long *)(this + 8) == 0) goto LAB_0010f5dc;
      maybe<pstore::command_line::option_*,_void>::maybe(&local_68,&handler);
      bVar1 = handler_set_value(&local_68,(string *)this);
      uVar3 = (uint)bVar1;
      if (local_68.valid_ == true) {
        local_68.valid_ = false;
      }
      *(undefined8 *)(this + 8) = 0;
      **(undefined1 **)this = 0;
    }
    if (handler.valid_ == true) {
      handler._0_8_ = handler._0_8_ & 0xffffffffffffff00;
    }
  }
  std::__cxx11::string::string((string *)&local_88,name,&local_bb);
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_58._32_8_ = 0;
  report_unknown_option<std::ostream>
            (arg_name,&local_88,
             (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)local_58,(basic_ostream<char,_std::char_traits<char>_> *)program_name);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  reset((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         *)local_58);
  std::__cxx11::string::~string((string *)&local_88);
  uVar5 = 0;
LAB_0010f5dc:
  local_58[0] = uVar5;
  std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool,_true>
            (__return_storage_ptr__,&handler,(bool *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<maybe<option *>, bool> process_single_dash (std::string arg_name,
                                                                   std::string const & program_name,
                                                                   ErrorStream & errs) {
                PSTORE_ASSERT (starts_with (arg_name, "-"));
                arg_name.erase (0, 1U); // Remove the leading dash.

                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};
                while (ok && !arg_name.empty ()) {
                    char const name[2]{arg_name[0], '\0'};
                    handler = find_handler (name);
                    if (!handler || (*handler)->is_positional ()) {
                        report_unknown_option (program_name, name, nothing<std::string> (), errs);
                        ok = false;
                        break;
                    }

                    if ((*handler)->takes_argument ()) {
                        arg_name.erase (0, 1U);
                        if (arg_name.length () == 0U) {
                            // No value was supplied immediately after the argument name. It
                            // could be the next argument.
                            break;
                        }
                        ok = handler_set_value (handler, arg_name);
                        arg_name.clear ();
                    } else {
                        arg_name.erase (0, 1U);
                        ok = (*handler)->add_occurrence ();
                    }
                    handler.reset ();
                }
                return std::make_tuple (std::move (handler), ok.get ());
            }